

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itch50_handler.cc
# Opt level: O0

void __thiscall
helix::nasdaq::itch50_handler::process_msg(itch50_handler *this,itch50_stock_directory *m)

{
  char *timestamp;
  size_type sVar1;
  unordered_map<unsigned_long,_helix::order_book,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_helix::order_book>_>_>
  *this_00;
  value_type *__x;
  _Node_iterator_base<std::pair<const_unsigned_long,_helix::order_book>,_false> this_01;
  long in_RSI;
  size_t in_RDI;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_long,_helix::order_book>,_false,_false>,_bool>
  pVar2;
  order_book ob;
  string sym;
  undefined7 in_stack_fffffffffffffd78;
  undefined1 in_stack_fffffffffffffd7f;
  pair<const_unsigned_long,_helix::order_book> *in_stack_fffffffffffffd80;
  key_type *in_stack_fffffffffffffd88;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffd90;
  allocator *symbol;
  order_book *in_stack_fffffffffffffdc0;
  string local_148 [279];
  allocator local_31;
  string local_30 [48];
  
  timestamp = (char *)(in_RSI + 0xb);
  symbol = &local_31;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,timestamp,8,symbol);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  sVar1 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  if (sVar1 != 0) {
    std::__cxx11::string::string(local_148,local_30);
    itch50_timestamp(0x1405f2);
    this_00 = (unordered_map<unsigned_long,_helix::order_book,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_helix::order_book>_>_>
               *)std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                 ::at((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                       *)in_stack_fffffffffffffd80,
                      (key_type *)CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78));
    order_book::order_book(in_stack_fffffffffffffdc0,(string *)symbol,(uint64_t)timestamp,in_RDI);
    std::__cxx11::string::~string(local_148);
    __x = (value_type *)(in_RDI + 0x20);
    std::pair<const_unsigned_long,_helix::order_book>::
    pair<const_unsigned_short_&,_helix::order_book,_true>
              (in_stack_fffffffffffffd80,
               (unsigned_short *)CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78),
               (order_book *)0x140675);
    pVar2 = std::
            unordered_map<unsigned_long,_helix::order_book,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_helix::order_book>_>_>
            ::insert(this_00,__x);
    this_01._M_cur =
         (__node_type *)
         pVar2.first.
         super__Node_iterator_base<std::pair<const_unsigned_long,_helix::order_book>,_false>._M_cur;
    std::pair<const_unsigned_long,_helix::order_book>::~pair
              ((pair<const_unsigned_long,_helix::order_book> *)0x1406ad);
    order_book::~order_book((order_book *)this_01._M_cur);
  }
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void itch50_handler::process_msg(const itch50_stock_directory* m)
{
    std::string sym{m->Stock, ITCH_SYMBOL_LEN};
    if (_symbols.count(sym) > 0) {
        order_book ob{sym, itch50_timestamp(m->Timestamp), _symbol_max_orders.at(sym)};
        order_book_id_map.insert({m->StockLocate, std::move(ob)});
    }
}